

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_display.cpp
# Opt level: O3

void __thiscall cppurses::Text_display::scroll_down(Text_display *this,size_t n)

{
  ulong uVar1;
  ulong uVar2;
  size_t local_18;
  
  uVar2 = n + this->top_line_;
  uVar1 = ((long)(this->display_state_).
                 super__Vector_base<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->display_state_).
                 super__Vector_base<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4) - 1;
  if (uVar2 < uVar1) {
    uVar1 = uVar2;
  }
  this->top_line_ = uVar1;
  local_18 = n;
  (*(this->super_Widget)._vptr_Widget[3])();
  sig::
  Signal_impl<void(unsigned_long),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(unsigned_long)>,std::mutex>
  ::operator()((Signal_impl<void(unsigned_long),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(unsigned_long)>,std::mutex>
                *)(this->scrolled_down).pimpl_.
                  super___shared_ptr<sig::Signal_impl<void_(unsigned_long),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(unsigned_long)>,_std::mutex>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr,&local_18);
  return;
}

Assistant:

void Text_display::scroll_down(std::size_t n) {
    if (this->top_line() + n > this->last_line()) {
        top_line_ = this->last_line();
    } else {
        top_line_ += n;
    }
    this->update();
    scrolled_down(n);
}